

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O2

wchar_t archive_read_disk_descend(archive *_a)

{
  int *piVar1;
  tree *t;
  int iVar2;
  wchar_t wVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  t = (tree *)_a[1].vtable;
  iVar2 = __archive_check_magic(_a,0xbadb0c5,6,"archive_read_disk_descend");
  if (iVar2 == -0x1e) {
    return L'\xffffffe2';
  }
  if (t->visit_type != 1) {
    return L'\0';
  }
  if (t->descend == 0) {
    return L'\0';
  }
  wVar3 = tree_current_is_physical_dir(t);
  if (wVar3 == L'\0') {
    wVar3 = tree_current_is_dir(t);
    if (wVar3 == L'\0') goto LAB_0011ba83;
    uVar6 = 2;
    lVar4 = 0x118;
    lVar5 = 0x110;
  }
  else {
    uVar6 = 1;
    lVar4 = 0x88;
    lVar5 = 0x80;
  }
  tree_push(t,t->basename,t->current_filesystem_id,*(int64_t *)((long)&t->stack + lVar5),
            *(int64_t *)((long)&t->stack + lVar4),&t->restore_time);
  piVar1 = &t->stack->flags;
  *piVar1 = *piVar1 | uVar6;
LAB_0011ba83:
  t->descend = 0;
  return L'\0';
}

Assistant:

int
archive_read_disk_descend(struct archive *_a)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct tree *t = a->tree;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
	    "archive_read_disk_descend");

	if (t->visit_type != TREE_REGULAR || !t->descend)
		return (ARCHIVE_OK);

	if (tree_current_is_physical_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->lst.st_dev, t->lst.st_ino, &t->restore_time);
		t->stack->flags |= isDir;
	} else if (tree_current_is_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->st.st_dev, t->st.st_ino, &t->restore_time);
		t->stack->flags |= isDirLink;
	}
	t->descend = 0;
	return (ARCHIVE_OK);
}